

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_178f1b::fillPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  uint *puVar1;
  ulong uVar2;
  half *this;
  half **pphVar3;
  int in_ECX;
  int in_EDX;
  Array2D<Imath_3_2::half_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  uint i;
  int x;
  int y;
  float f;
  float local_24;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase
            (in_RSI,CONCAT44(in_EDX,in_ECX),
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar5 = 0; iVar5 < in_ECX; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
      puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar5);
      uVar2 = SUB168(ZEXT416(puVar1[iVar4]) * ZEXT816(2),0);
      if (SUB168(ZEXT416(puVar1[iVar4]) * ZEXT816(2),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      this = (half *)operator_new__(uVar2);
      pphVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](in_RSI,(long)iVar5);
      pphVar3[iVar4] = this;
      local_24 = 0.0;
      while( true ) {
        f = local_24;
        puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar5);
        if (puVar1[iVar4] <= (uint)f) break;
        Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](in_RSI,(long)iVar5);
        Imath_3_2::half::operator=(this,f);
        local_24 = (float)((int)local_24 + 1);
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}